

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

void ipc_on_connection(uv_stream_t *server,int status)

{
  undefined1 auVar1 [16];
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t buf;
  int r;
  int status_local;
  uv_stream_t *server_local;
  
  if (connection_accepted == 0) {
    buf.len._4_4_ = status;
    if ((long)status != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
              ,0x26a,"status","==","0",(long)status,"==",0);
      abort();
    }
    if (server != (uv_stream_t *)&tcp_server) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
              ,0x26b,"&tcp_server","==","server",&tcp_server,"==",server);
      abort();
    }
    buf.len._0_4_ = uv_tcp_init(tcp_server.loop,0x34bcf0);
    if ((long)(int)buf.len != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
              ,0x26e,"r","==","0",(long)(int)buf.len,"==",0);
      abort();
    }
    buf.len._0_4_ = uv_accept(&tcp_server,0x34bcf0);
    if ((long)(int)buf.len != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
              ,0x271,"r","==","0",(long)(int)buf.len,"==",0);
      abort();
    }
    uv_close(0x34bcf0,close_cb);
    auVar1 = uv_buf_init("accepted_connection\n",0x14);
    buf.base = auVar1._8_8_;
    eval_a = auVar1._0_8_;
    buf.len._0_4_ = uv_write2(&conn_notify_req,&channel,&eval_a,1,0,conn_notify_write_cb);
    if ((long)(int)buf.len != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
              ,0x278,"r","==","0",(long)(int)buf.len,"==",0);
      abort();
    }
    connection_accepted = 1;
  }
  return;
}

Assistant:

static void ipc_on_connection(uv_stream_t* server, int status) {
  int r;
  uv_buf_t buf;

  if (!connection_accepted) {
    /*
     * Accept the connection and close it.  Also let the other
     * side know.
     */
    ASSERT_OK(status);
    ASSERT_PTR_EQ(&tcp_server, server);

    r = uv_tcp_init(server->loop, &conn.conn);
    ASSERT_OK(r);

    r = uv_accept(server, (uv_stream_t*)&conn.conn);
    ASSERT_OK(r);

    uv_close((uv_handle_t*)&conn.conn, close_cb);

    buf = uv_buf_init("accepted_connection\n", 20);
    r = uv_write2(&conn_notify_req, (uv_stream_t*)&channel, &buf, 1,
      NULL, conn_notify_write_cb);
    ASSERT_OK(r);

    connection_accepted = 1;
  }
}